

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Write<int> __thiscall
Omega_h::multiply_each<int>(Omega_h *this,Read<int> *a,Read<int> *b,string *name)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar1;
  Write<int> WVar2;
  undefined1 local_140 [8];
  type f;
  int width;
  string *name_local;
  Read<int> *b_local;
  Read<int> *a_local;
  Write<int> *c;
  ulong local_60;
  ulong local_50;
  ulong local_40;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  Write<int>::Write((Write<int> *)this,(LO)(local_10 >> 2),name);
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_20 >> 2) == 0) {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_30 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_30 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    pvVar1 = extraout_RDX;
    if ((int)(local_30 >> 2) != 0) {
      fail("assertion %s failed at %s +%d\n","a.size() == 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
           ,0x6b);
    }
  }
  else {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_40 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_40 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
      local_50 = ((b->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_50 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
    }
    local_140._0_4_ = divide_no_remainder<int>((int)(local_40 >> 2),(int)(local_50 >> 2));
    f.b.write_.shared_alloc_.direct_ptr._4_4_ = local_140._0_4_;
    Write<int>::Write((Write<int> *)&f,(Write<int> *)this);
    Read<int>::Read((Read<int> *)&f.c.shared_alloc_.direct_ptr,a);
    Read<int>::Read((Read<int> *)&f.a.write_.shared_alloc_.direct_ptr,b);
    if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
      local_60 = ((b->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_60 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
    }
    parallel_for<Omega_h::multiply_each<int>(Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::_lambda(int)_1_>
              ((LO)(local_60 >> 2),(type *)local_140,"multiply_each");
    multiply_each<int>(Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::
    {lambda(int)#1}::~basic_string((_lambda_int__1_ *)local_140);
    pvVar1 = extraout_RDX_00;
  }
  WVar2.shared_alloc_.direct_ptr = pvVar1;
  WVar2.shared_alloc_.alloc = (Alloc *)this;
  return (Write<int>)WVar2.shared_alloc_;
}

Assistant:

Write<T> multiply_each(Read<T> a, Read<T> b, std::string const& name) {
  Write<T> c(a.size(), name);
  if (b.size() == 0) {
    OMEGA_H_CHECK(a.size() == 0);
    return c;
  }
  auto width = divide_no_remainder(a.size(), b.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    for (Int j = 0; j < width; ++j) {
      c[i * width + j] = a[i * width + j] * b[i];
    }
  };
  parallel_for(b.size(), f, "multiply_each");
  return c;
}